

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O2

long __thiscall HACD::Graph::AddEdge(Graph *this,long v1,long v2)

{
  pointer pGVar1;
  long name;
  long lVar2;
  GraphEdge local_60;
  
  lVar2 = (long)(this->m_edges).
                super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->m_edges).
                super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
                super__Vector_impl_data._M_start;
  name = lVar2 / 0x30;
  GraphEdge::GraphEdge(&local_60);
  std::vector<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>::emplace_back<HACD::GraphEdge>
            (&this->m_edges,&local_60);
  pGVar1 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  *(long *)((long)pGVar1 + lVar2) = name;
  *(long *)((long)pGVar1 + lVar2 + 8) = v1;
  *(long *)((long)pGVar1 + lVar2 + 0x10) = v2;
  GraphVertex::AddEdge
            ((this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start + v1,name);
  GraphVertex::AddEdge
            ((this->m_vertices).
             super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
             super__Vector_impl_data._M_start + v2,name);
  this->m_nE = this->m_nE + 1;
  return name;
}

Assistant:

long Graph::AddEdge(long v1, long v2)
    {
		size_t name = m_edges.size();
		m_edges.push_back(GraphEdge());
        m_edges[name].m_name = static_cast<long>(name);
        m_edges[name].m_v1 = v1;
        m_edges[name].m_v2 = v2;
        m_vertices[v1].AddEdge(static_cast<long>(name));
        m_vertices[v2].AddEdge(static_cast<long>(name));
        m_nE++;
		return static_cast<long>(name);
    }